

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeAddOp
          (ScalarEvolutionAnalysis *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  Instruction *pIVar4;
  SENode *pSVar5;
  SENode *local_30;
  SENode *op2;
  SENode *op1;
  DefUseManager *def_use;
  Instruction *inst_local;
  ScalarEvolutionAnalysis *this_local;
  
  OVar2 = Instruction::opcode(inst);
  if (OVar2 != OpIAdd) {
    OVar2 = Instruction::opcode(inst);
    bVar1 = false;
    if (OVar2 != OpISub) goto LAB_00445f07;
  }
  bVar1 = true;
LAB_00445f07:
  if (!bVar1) {
    __assert_fail("(inst->opcode() == spv::Op::OpIAdd || inst->opcode() == spv::Op::OpISub) && \"Add node must be created from a OpIAdd or OpISub instruction\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                  ,0xe6,
                  "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeAddOp(const Instruction *)"
                 );
  }
  this_00 = IRContext::get_def_use_mgr(this->context_);
  uVar3 = Instruction::GetSingleWordInOperand(inst,0);
  pIVar4 = analysis::DefUseManager::GetDef(this_00,uVar3);
  pSVar5 = AnalyzeInstruction(this,pIVar4);
  uVar3 = Instruction::GetSingleWordInOperand(inst,1);
  pIVar4 = analysis::DefUseManager::GetDef(this_00,uVar3);
  local_30 = AnalyzeInstruction(this,pIVar4);
  OVar2 = Instruction::opcode(inst);
  if (OVar2 == OpISub) {
    local_30 = CreateNegation(this,local_30);
  }
  pSVar5 = CreateAddNode(this,pSVar5,local_30);
  return pSVar5;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeAddOp(const Instruction* inst) {
  assert((inst->opcode() == spv::Op::OpIAdd ||
          inst->opcode() == spv::Op::OpISub) &&
         "Add node must be created from a OpIAdd or OpISub instruction");

  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  SENode* op1 =
      AnalyzeInstruction(def_use->GetDef(inst->GetSingleWordInOperand(0)));

  SENode* op2 =
      AnalyzeInstruction(def_use->GetDef(inst->GetSingleWordInOperand(1)));

  // To handle subtraction we wrap the second operand in a unary negation node.
  if (inst->opcode() == spv::Op::OpISub) {
    op2 = CreateNegation(op2);
  }

  return CreateAddNode(op1, op2);
}